

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpegd_vdpu2.c
# Opt level: O0

MPP_RET hal_jpegd_vdpu2_start(void *hal,HalTaskInfo *task)

{
  undefined8 uVar1;
  undefined1 auStack_58 [4];
  RK_U32 reg_size;
  MppDevRegRdCfg rd_cfg;
  MppDevRegWrCfg wr_cfg;
  RK_U32 *regs;
  JpegdHalCtx *JpegHalCtx;
  MPP_RET ret;
  HalTaskInfo *task_local;
  void *hal_local;
  
  JpegHalCtx._4_4_ = MPP_OK;
  uVar1 = *(undefined8 *)((long)hal + 0x18);
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","enter\n","hal_jpegd_vdpu2_start");
  }
  if (((task->dec).flags.val >> 2 & 1) == 0) {
    mpp_get_ioctl_version();
    rd_cfg._8_8_ = uVar1;
    JpegHalCtx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),4,&rd_cfg.size);
    if (JpegHalCtx._4_4_ == MPP_OK) {
      rd_cfg.reg._0_4_ = 0x27c;
      rd_cfg.reg._4_4_ = 0;
      _auStack_58 = uVar1;
      JpegHalCtx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),5,auStack_58);
      if (JpegHalCtx._4_4_ == MPP_OK) {
        JpegHalCtx._4_4_ = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x10),0xf,(void *)0x0);
        if (JpegHalCtx._4_4_ == MPP_OK) {
          if ((jpegd_debug & 1) == 0) {
            return MPP_OK;
          }
          _mpp_log_l(4,"HAL_JPEG_VDPU2","exit\n","hal_jpegd_vdpu2_start");
          return MPP_OK;
        }
        _mpp_log_l(2,"HAL_JPEG_VDPU2","send cmd failed %d\n","hal_jpegd_vdpu2_start",
                   (ulong)(uint)JpegHalCtx._4_4_);
      }
      else {
        _mpp_log_l(2,"HAL_JPEG_VDPU2","set register read failed %d\n","hal_jpegd_vdpu2_start",
                   (ulong)(uint)JpegHalCtx._4_4_);
      }
    }
    else {
      _mpp_log_l(2,"HAL_JPEG_VDPU2","set register write failed %d\n","hal_jpegd_vdpu2_start",
                 (ulong)(uint)JpegHalCtx._4_4_);
    }
  }
  (task->dec).flags.val = (task->dec).flags.val & 0xfffffffffffffffb | 4;
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"HAL_JPEG_VDPU2","exit\n","hal_jpegd_vdpu2_start");
  }
  return JpegHalCtx._4_4_;
}

Assistant:

MPP_RET hal_jpegd_vdpu2_start(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    JpegdHalCtx *JpegHalCtx = (JpegdHalCtx *)hal;
    RK_U32 *regs = (RK_U32 *)JpegHalCtx->regs;

    jpegd_dbg_func("enter\n");
    if (task->dec.flags.parse_err)
        goto __RETURN;

    do {
        MppDevRegWrCfg wr_cfg;
        MppDevRegRdCfg rd_cfg;
        RK_U32 reg_size = mpp_get_ioctl_version() ?
                          sizeof(((JpegdIocRegInfo *)0)->regs) :
                          sizeof(JpegdIocRegInfo) - EXTRA_INFO_SIZE;

        wr_cfg.reg = regs;
        wr_cfg.size = reg_size;
        wr_cfg.offset = 0;

        ret = mpp_dev_ioctl(JpegHalCtx->dev, MPP_DEV_REG_WR, &wr_cfg);
        if (ret) {
            mpp_err_f("set register write failed %d\n", ret);
            goto __RETURN;
        }

        reg_size = sizeof(((JpegdIocRegInfo *)0)->regs);

        rd_cfg.reg = regs;
        rd_cfg.size = reg_size;
        rd_cfg.offset = 0;

        ret = mpp_dev_ioctl(JpegHalCtx->dev, MPP_DEV_REG_RD, &rd_cfg);
        if (ret) {
            mpp_err_f("set register read failed %d\n", ret);
            goto __RETURN;
        }

        ret = mpp_dev_ioctl(JpegHalCtx->dev, MPP_DEV_CMD_SEND, NULL);
        if (ret) {
            mpp_err_f("send cmd failed %d\n", ret);
            goto __RETURN;
        }
    } while (0);

    jpegd_dbg_func("exit\n");
    return ret;

__RETURN:
    task->dec.flags.parse_err = 1;
    jpegd_dbg_func("exit\n");
    return ret;
}